

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O3

int Abc_NtkMfsSolveSatResub
              (Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int fOnlyRemove,int fSkipUpdate)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pNode_00;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  void **ppvVar9;
  Hop_Obj_t *pHVar10;
  abctime aVar11;
  void *pvVar12;
  abctime aVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  Mfs_Par_t *pMVar19;
  ulong uVar20;
  int nCands;
  long lVar21;
  timespec ts;
  int pCands [12];
  
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsResub.c"
                  ,0xae,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)");
  }
  uVar20 = (ulong)(uint)iFanin;
  p->nTryRemoves = p->nTryRemoves + 1;
  pVVar4 = p->vDivCexes;
  if (0 < pVVar4->nSize) {
    iVar7 = p->nDivWords;
    lVar21 = 0;
    do {
      memset(pVVar4->pArray[lVar21],0xff,(long)iVar7 << 2);
      lVar21 = lVar21 + 1;
    } while (lVar21 < pVVar4->nSize);
  }
  p->nCexes = 0;
  if (p->pPars->fVeryVerbose != 0) {
    uVar8 = pNode->Id;
    uVar15 = *(uint *)&pNode->field_0x14;
    uVar1 = p->vSupp->nSize;
    uVar2 = p->vNodes->nSize;
    iVar7 = p->vDivs->nSize;
    uVar3 = (pNode->vFanins).nSize;
    lVar21 = (long)(pNode->vFanins).pArray[(uint)iFanin];
    pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[lVar21];
    uVar18 = 0;
    if ((pNode_00->vFanouts).nSize == 1) {
      uVar6 = Abc_NodeMffcLabel(pNode_00,(Vec_Ptr_t *)0x0);
      uVar18 = (ulong)uVar6;
    }
    printf("%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n",
           (ulong)uVar8,(ulong)(uVar15 >> 0xc),(ulong)uVar1,(ulong)uVar2,(ulong)(iVar7 - uVar3),
           lVar21,uVar20,(ulong)uVar3,uVar18);
  }
  p->vMfsFanins->nSize = 0;
  iVar7 = (pNode->vFanins).nSize;
  nCands = 0;
  if (0 < iVar7) {
    uVar18 = 0;
    nCands = 0;
    do {
      if ((uint)iFanin != uVar18) {
        pvVar12 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar18]];
        pVVar4 = p->vMfsFanins;
        uVar8 = pVVar4->nSize;
        if (uVar8 == pVVar4->nCap) {
          if ((int)uVar8 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar9;
            pVVar4->nCap = 0x10;
          }
          else {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar8 << 4);
            }
            pVVar4->pArray = ppvVar9;
            pVVar4->nCap = uVar8 * 2;
          }
        }
        else {
          ppvVar9 = pVVar4->pArray;
        }
        iVar7 = pVVar4->nSize;
        pVVar4->nSize = iVar7 + 1;
        ppvVar9[iVar7] = pvVar12;
        iVar7 = (pNode->vFanins).nSize;
        uVar16 = (uint)(p->vDivs->nSize - iVar7) + uVar18;
        iVar14 = (int)uVar16;
        if ((iVar14 < 0) || (p->vProjVarsSat->nSize <= iVar14)) goto LAB_004ca44a;
        lVar21 = (long)nCands;
        nCands = nCands + 1;
        pCands[lVar21] = p->vProjVarsSat->pArray[uVar16 & 0xffffffff] * 2 + 1;
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)iVar7);
  }
  iVar7 = Abc_NtkMfsTryResubOnce(p,pCands,nCands);
  if (iVar7 != -1) {
    if (iVar7 == 1) {
      if (p->pPars->fVeryVerbose != 0) {
        printf("Node %d: Fanin %d can be removed.\n",(ulong)(uint)pNode->Id,uVar20);
      }
      p->nNodesResub = p->nNodesResub + 1;
      p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
      if (fSkipUpdate == 0) {
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar21 = 1;
        }
        else {
          lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        pHVar10 = Abc_NtkMfsInterplate(p,pCands,nCands);
        if (pHVar10 == (Hop_Obj_t *)0x0) {
          return 0;
        }
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar10);
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeInt = p->timeInt + lVar17 + lVar21;
        p->nRemoves = p->nRemoves + 1;
      }
      return 1;
    }
    if (fOnlyRemove != 0) {
      return 0;
    }
    pMVar19 = p->pPars;
    if (pMVar19->fRrOnly != 0) {
      return 0;
    }
    p->nTryResubs = p->nTryResubs + 1;
    uVar8 = p->nCexes;
    do {
      uVar8 = (((int)uVar8 >> 5) + 1) - (uint)((uVar8 & 0x1f) == 0);
      if (p->nDivWords < (int)uVar8) {
        __assert_fail("nWords <= p->nDivWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsResub.c"
                      ,0x100,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)")
        ;
      }
      iVar7 = p->vDivs->nSize;
      iVar14 = (pNode->vFanins).nSize;
      uVar18 = 0;
      uVar15 = iVar7 - iVar14;
      if (uVar15 != 0 && iVar14 <= iVar7) {
        uVar18 = 0;
        do {
          if (pMVar19->fPower == 0) goto LAB_004ca212;
          if ((long)iVar7 <= (long)uVar18) goto LAB_004ca488;
          pVVar5 = p->vProbs;
          if (pVVar5 == (Vec_Int_t *)0x0) {
LAB_004ca212:
            if ((long)p->vDivCexes->nSize <= (long)uVar18) {
LAB_004ca488:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if ((int)uVar8 < 1) {
              uVar16 = 0;
            }
            else {
              uVar16 = 0;
              while (*(int *)((long)p->vDivCexes->pArray[uVar18] + uVar16 * 4) == -1) {
                uVar16 = uVar16 + 1;
                if (uVar8 == uVar16) goto LAB_004ca264;
              }
            }
            if ((uint)uVar16 == uVar8) break;
          }
          else {
            uVar1 = *(uint *)((long)p->vDivs->pArray[uVar18] + 0x10);
            if (pVVar5->nSize <= (int)uVar1) goto LAB_004ca212;
            if ((int)uVar1 < 0) goto LAB_004ca44a;
            if ((float)pVVar5->pArray[uVar1] < 0.15) goto LAB_004ca212;
          }
          uVar18 = uVar18 + 1;
          if (uVar18 == uVar15) {
            return 0;
          }
        } while( true );
      }
LAB_004ca264:
      uVar8 = (uint)uVar18;
      if (uVar8 == uVar15) {
        return 0;
      }
      if (p->vProjVarsSat->nSize <= (int)uVar8) {
LAB_004ca44a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pCands[nCands] = p->vProjVarsSat->pArray[uVar18 & 0xffffffff] * 2 + 1;
      iVar7 = Abc_NtkMfsTryResubOnce(p,pCands,nCands + 1);
      if (iVar7 == -1) {
        return 0;
      }
      if (iVar7 == 1) {
        if (p->pPars->fVeryVerbose != 0) {
          printf("Node %d: Fanin %d can be replaced by divisor %d.\n",(ulong)(uint)pNode->Id,uVar20,
                 uVar18 & 0xffffffff);
        }
        p->nNodesResub = p->nNodesResub + 1;
        p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
        if (fSkipUpdate != 0) {
          return 1;
        }
        aVar11 = Abc_Clock();
        pHVar10 = Abc_NtkMfsInterplate(p,pCands,nCands + 1);
        if (pHVar10 != (Hop_Obj_t *)0x0) {
          pVVar4 = p->vMfsFanins;
          pvVar12 = Vec_PtrEntry(p->vDivs,uVar8);
          Vec_PtrPush(pVVar4,pvVar12);
          Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar10);
          aVar13 = Abc_Clock();
          p->timeInt = p->timeInt + (aVar13 - aVar11);
          p->nResubs = p->nResubs + 1;
          return 1;
        }
        return 0;
      }
      uVar8 = p->nCexes;
      pMVar19 = p->pPars;
    } while ((int)uVar8 < pMVar19->nWinMax);
    if (pMVar19->fVeryVerbose == 0) {
      return 0;
    }
    printf("Node %d: Cannot find replacement for fanin %d.\n",(ulong)(uint)pNode->Id,uVar20);
  }
  return 0;
}

Assistant:

int Abc_NtkMfsSolveSatResub( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int fOnlyRemove, int fSkipUpdate )
{
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 200;// || pNode->Id == 556;
    unsigned * pData;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, i, nCands, nWords, w;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    p->nTryRemoves++;

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( p->pPars->fVeryVerbose )
    {
//        printf( "\n" );
        printf( "%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            Abc_ObjFaninId(pNode, iFanin), iFanin, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin), NULL) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Node %d: Fanin %d can be removed.\n", pNode->Id, iFanin );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
        if ( fSkipUpdate )
            return 1;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        p->nRemoves++;
        return 1;
    }

    if ( fOnlyRemove || p->pPars->fRrOnly )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = -1;
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        for ( iVar = 0; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.15 )
                    continue;
            }
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
            for ( w = 0; w < nWords; w++ )
                if ( pData[w] != ~0 )
                    break;
            if ( w == nWords )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+1 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Node %d: Fanin %d can be replaced by divisor %d.\n", pNode->Id, iFanin, iVar );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
            if ( fSkipUpdate )
                return 1;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+1 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            p->nResubs++;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    if ( p->pPars->fVeryVerbose )
        printf( "Node %d: Cannot find replacement for fanin %d.\n", pNode->Id, iFanin );
    return 0;
}